

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::ParseAddtlInfo_SnapGeneratorVirtualScriptFunctionInfo
               (SnapObject *snpObject,FileReader *reader,SlabAllocator *alloc)

{
  SnapGeneratorVirtualScriptFunctionInfo *addtlInfo;
  TTD_PTR_ID TVar1;
  SnapGeneratorVirtualScriptFunctionInfo *sgvsf;
  SlabAllocator *alloc_local;
  FileReader *reader_local;
  SnapObject *snpObject_local;
  
  addtlInfo = SlabAllocatorBase<0>::
              SlabAllocateStruct<TTD::NSSnapObjects::SnapGeneratorVirtualScriptFunctionInfo>(alloc);
  ParseAddtlInfo_SnapScriptFunctionInfoEx(&addtlInfo->super_SnapScriptFunctionInfo,reader,alloc);
  TVar1 = FileReader::ReadAddr(reader,objectId,true);
  addtlInfo->realFunction = TVar1;
  SnapObjectSetAddtlInfoAs<TTD::NSSnapObjects::SnapGeneratorVirtualScriptFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)35>
            (snpObject,addtlInfo);
  return;
}

Assistant:

void ParseAddtlInfo_SnapGeneratorVirtualScriptFunctionInfo(SnapObject *snpObject, FileReader *reader, SlabAllocator &alloc)
        {
            SnapGeneratorVirtualScriptFunctionInfo* sgvsf = alloc.SlabAllocateStruct<SnapGeneratorVirtualScriptFunctionInfo>();
            ParseAddtlInfo_SnapScriptFunctionInfoEx(sgvsf, reader, alloc);
            sgvsf->realFunction = reader->ReadAddr(NSTokens::Key::objectId, true);
            SnapObjectSetAddtlInfoAs<SnapGeneratorVirtualScriptFunctionInfo*, SnapObjectType::SnapGeneratorVirtualScriptFunction>(snpObject, sgvsf);
        }